

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

void __thiscall
dg::llvmdg::legacy::GraphBuilder::GraphBuilder
          (GraphBuilder *this,LLVMPointerAnalysis *pointsToAnalysis)

{
  LLVMPointerAnalysisOptions *pLVar1;
  LLVMPointerAnalysis *in_RSI;
  undefined8 *in_RDI;
  byte local_21;
  
  *in_RDI = in_RSI;
  if (in_RSI == (LLVMPointerAnalysis *)0x0) {
    local_21 = 0;
  }
  else {
    pLVar1 = LLVMPointerAnalysis::getOptions(in_RSI);
    local_21 = pLVar1->threads;
  }
  *(byte *)(in_RDI + 1) = local_21 & 1;
  std::
  map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
  ::map((map<const_llvm::Function_*,_dg::llvmdg::legacy::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::legacy::Function_*>_>_>
         *)0x21c4f8);
  std::
  unordered_map<const_llvm::BasicBlock_*,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>_>_>
  ::unordered_map((unordered_map<const_llvm::BasicBlock_*,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>,_std::hash<const_llvm::BasicBlock_*>,_std::equal_to<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_std::vector<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>_>_>
                   *)0x21c506);
  return;
}

Assistant:

GraphBuilder::GraphBuilder(dg::LLVMPointerAnalysis *pointsToAnalysis)
        : pointsToAnalysis_(pointsToAnalysis),
          threads(pointsToAnalysis ? pointsToAnalysis->getOptions().threads
                                   : false) {}